

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

double solve_problem(int nx,int nt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint actual_size;
  ulong uVar4;
  double dVar5;
  vec current_layer;
  vec b;
  TridiagonalMatrix m;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  actual_size = nx - 1;
  iVar1 = compute_linear_system_size(actual_size);
  m.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&current_layer,(long)iVar1,(value_type_conflict *)&m,(allocator_type *)&b);
  uVar3 = 0;
  uVar4 = (ulong)actual_size;
  if ((int)actual_size < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = exact_solution((double)((int)uVar3 + 1) * (0.7853981633974483 / (double)nx),0.0);
    current_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = dVar5;
  }
  construct_matrix(&m,nx,nt);
  iVar1 = 0;
  if (0 < nt) {
    iVar1 = nt;
  }
  for (iVar2 = 1; iVar2 - iVar1 != 1; iVar2 = iVar2 + 1) {
    construct_rhs((vec *)&b.super__Vector_base<double,_std::allocator<double>_>,nx,nt,&current_layer
                  ,(double)iVar2 * (1.0 / (double)nt),f,exact_solution);
    cyclic_reduction((vec *)&local_48,&m,
                     (vec *)&b.super__Vector_base<double,_std::allocator<double>_>);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&current_layer,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&b.super__Vector_base<double,_std::allocator<double>_>);
  }
  dVar5 = compute_error(&current_layer,nx);
  TridiagonalMatrix::~TridiagonalMatrix(&m);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&current_layer.super__Vector_base<double,_std::allocator<double>_>);
  return dVar5;
}

Assistant:

double solve_problem(int nx, int nt)
{
	int size = compute_linear_system_size(nx - 1);
	vec current_layer(size, 0.0);
	double h = X / nx;
	double tau = T / nt;

	for (int i = 0; i < nx - 1; i++)
	{
		current_layer[i] = exact_solution(h * (i + 1), 0.0);
	}

	TridiagonalMatrix m = construct_matrix(nx, nt);
	for (int i = 1; i <= nt; i++)
	{
		vec b = construct_rhs(nx, nt, current_layer, i * tau,
			f, exact_solution);
		current_layer = cyclic_reduction(m, b);
	}

	double error = compute_error(current_layer, nx);

	return error;
}